

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void rgb_rgb_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                    JSAMPARRAY output_buf,int num_rows)

{
  uint uVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPARRAY ppJVar5;
  JDIMENSION num_cols_1;
  JDIMENSION col_1;
  JSAMPROW outptr_1;
  JSAMPROW inptr2_1;
  JSAMPROW inptr1_1;
  JSAMPROW inptr0_1;
  JDIMENSION num_cols_2;
  JDIMENSION col_2;
  JSAMPROW outptr_2;
  JSAMPROW inptr2_2;
  JSAMPROW inptr1_2;
  JSAMPROW inptr0_2;
  JDIMENSION num_cols_3;
  JDIMENSION col_3;
  JSAMPROW outptr_3;
  JSAMPROW inptr2_3;
  JSAMPROW inptr1_3;
  JSAMPROW inptr0_3;
  JDIMENSION num_cols_4;
  JDIMENSION col_4;
  JSAMPROW outptr_4;
  JSAMPROW inptr2_4;
  JSAMPROW inptr1_4;
  JSAMPROW inptr0_4;
  JDIMENSION num_cols_5;
  JDIMENSION col_5;
  JSAMPROW outptr_5;
  JSAMPROW inptr2_5;
  JSAMPROW inptr1_5;
  JSAMPROW inptr0_5;
  JDIMENSION num_cols_6;
  JDIMENSION col_6;
  JSAMPROW outptr_6;
  JSAMPROW inptr2_6;
  JSAMPROW inptr1_6;
  JSAMPROW inptr0_6;
  uint local_22c;
  JSAMPROW local_228;
  int local_204;
  JSAMPARRAY local_200;
  uint local_1f4;
  uint local_1dc;
  JSAMPROW local_1d8;
  int local_1b4;
  JSAMPARRAY local_1b0;
  uint local_1a4;
  uint local_18c;
  JSAMPROW local_188;
  int local_164;
  JSAMPARRAY local_160;
  uint local_154;
  uint local_13c;
  JSAMPROW local_138;
  int local_114;
  JSAMPARRAY local_110;
  uint local_104;
  uint local_ec;
  JSAMPROW local_e8;
  int local_c4;
  JSAMPARRAY local_c0;
  uint local_b4;
  uint local_9c;
  JSAMPROW local_98;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION input_row_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  JDIMENSION num_cols;
  JDIMENSION col;
  JSAMPROW outptr;
  JSAMPROW inptr2;
  JSAMPROW inptr1;
  JSAMPROW inptr0;
  int local_24;
  JSAMPARRAY local_20;
  uint local_14;
  
  switch(cinfo->out_color_space) {
  case JCS_EXT_RGB:
    uVar1 = cinfo->output_width;
    local_204 = num_rows;
    local_200 = output_buf;
    local_1f4 = input_row;
    while (local_204 = local_204 + -1, -1 < local_204) {
      pJVar2 = (*input_buf)[local_1f4];
      pJVar3 = input_buf[1][local_1f4];
      pJVar4 = input_buf[2][local_1f4];
      local_1f4 = local_1f4 + 1;
      ppJVar5 = local_200 + 1;
      local_228 = *local_200;
      for (local_22c = 0; local_200 = ppJVar5, local_22c < uVar1; local_22c = local_22c + 1) {
        *local_228 = pJVar2[local_22c];
        local_228[1] = pJVar3[local_22c];
        local_228[2] = pJVar4[local_22c];
        local_228 = local_228 + 3;
      }
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    uVar1 = cinfo->output_width;
    local_1b4 = num_rows;
    local_1b0 = output_buf;
    local_1a4 = input_row;
    while (local_1b4 = local_1b4 + -1, -1 < local_1b4) {
      pJVar2 = (*input_buf)[local_1a4];
      pJVar3 = input_buf[1][local_1a4];
      pJVar4 = input_buf[2][local_1a4];
      local_1a4 = local_1a4 + 1;
      ppJVar5 = local_1b0 + 1;
      local_1d8 = *local_1b0;
      for (local_1dc = 0; local_1b0 = ppJVar5, local_1dc < uVar1; local_1dc = local_1dc + 1) {
        *local_1d8 = pJVar2[local_1dc];
        local_1d8[1] = pJVar3[local_1dc];
        local_1d8[2] = pJVar4[local_1dc];
        local_1d8[3] = 0xff;
        local_1d8 = local_1d8 + 4;
      }
    }
    break;
  case JCS_EXT_BGR:
    uVar1 = cinfo->output_width;
    local_164 = num_rows;
    local_160 = output_buf;
    local_154 = input_row;
    while (local_164 = local_164 + -1, -1 < local_164) {
      pJVar2 = (*input_buf)[local_154];
      pJVar3 = input_buf[1][local_154];
      pJVar4 = input_buf[2][local_154];
      local_154 = local_154 + 1;
      ppJVar5 = local_160 + 1;
      local_188 = *local_160;
      for (local_18c = 0; local_160 = ppJVar5, local_18c < uVar1; local_18c = local_18c + 1) {
        local_188[2] = pJVar2[local_18c];
        local_188[1] = pJVar3[local_18c];
        *local_188 = pJVar4[local_18c];
        local_188 = local_188 + 3;
      }
    }
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    uVar1 = cinfo->output_width;
    local_114 = num_rows;
    local_110 = output_buf;
    local_104 = input_row;
    while (local_114 = local_114 + -1, -1 < local_114) {
      pJVar2 = (*input_buf)[local_104];
      pJVar3 = input_buf[1][local_104];
      pJVar4 = input_buf[2][local_104];
      local_104 = local_104 + 1;
      ppJVar5 = local_110 + 1;
      local_138 = *local_110;
      for (local_13c = 0; local_110 = ppJVar5, local_13c < uVar1; local_13c = local_13c + 1) {
        local_138[2] = pJVar2[local_13c];
        local_138[1] = pJVar3[local_13c];
        *local_138 = pJVar4[local_13c];
        local_138[3] = 0xff;
        local_138 = local_138 + 4;
      }
    }
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    uVar1 = cinfo->output_width;
    local_c4 = num_rows;
    local_c0 = output_buf;
    local_b4 = input_row;
    while (local_c4 = local_c4 + -1, -1 < local_c4) {
      pJVar2 = (*input_buf)[local_b4];
      pJVar3 = input_buf[1][local_b4];
      pJVar4 = input_buf[2][local_b4];
      local_b4 = local_b4 + 1;
      ppJVar5 = local_c0 + 1;
      local_e8 = *local_c0;
      for (local_ec = 0; local_c0 = ppJVar5, local_ec < uVar1; local_ec = local_ec + 1) {
        local_e8[3] = pJVar2[local_ec];
        local_e8[2] = pJVar3[local_ec];
        local_e8[1] = pJVar4[local_ec];
        *local_e8 = 0xff;
        local_e8 = local_e8 + 4;
      }
    }
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    uVar1 = cinfo->output_width;
    num_rows_local = num_rows;
    output_buf_local = output_buf;
    input_row_local = input_row;
    while (num_rows_local = num_rows_local + -1, -1 < num_rows_local) {
      pJVar2 = (*input_buf)[input_row_local];
      pJVar3 = input_buf[1][input_row_local];
      pJVar4 = input_buf[2][input_row_local];
      input_row_local = input_row_local + 1;
      ppJVar5 = output_buf_local + 1;
      local_98 = *output_buf_local;
      for (local_9c = 0; output_buf_local = ppJVar5, local_9c < uVar1; local_9c = local_9c + 1) {
        local_98[1] = pJVar2[local_9c];
        local_98[2] = pJVar3[local_9c];
        local_98[3] = pJVar4[local_9c];
        *local_98 = 0xff;
        local_98 = local_98 + 4;
      }
    }
    break;
  default:
    uVar1 = cinfo->output_width;
    local_24 = num_rows;
    local_20 = output_buf;
    local_14 = input_row;
    while (local_24 = local_24 + -1, -1 < local_24) {
      pJVar2 = (*input_buf)[local_14];
      pJVar3 = input_buf[1][local_14];
      pJVar4 = input_buf[2][local_14];
      local_14 = local_14 + 1;
      ppJVar5 = local_20 + 1;
      outptr = *local_20;
      for (col = 0; local_20 = ppJVar5, col < uVar1; col = col + 1) {
        *outptr = pJVar2[col];
        outptr[1] = pJVar3[col];
        outptr[2] = pJVar4[col];
        outptr = outptr + 3;
      }
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_rgb_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    rgb_extrgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                                num_rows);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    rgb_extrgbx_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_BGR:
    rgb_extbgr_convert_internal(cinfo, input_buf, input_row, output_buf,
                                num_rows);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    rgb_extbgrx_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    rgb_extxbgr_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    rgb_extxrgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  default:
    rgb_rgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                             num_rows);
    break;
  }
}